

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O0

void __thiscall CLayers::Init(CLayers *this,IKernel *pKernel,IMap *pMap)

{
  IMap *in_RDX;
  IKernel *in_RDI;
  IMap *local_28;
  
  local_28 = in_RDX;
  if (in_RDX == (IMap *)0x0) {
    local_28 = IKernel::RequestInterface<IMap>(in_RDI);
  }
  in_RDI[4]._vptr_IKernel = (_func_int **)local_28;
  (**(code **)(*in_RDI[4]._vptr_IKernel + 0x30))
            (in_RDI[4]._vptr_IKernel,4,(undefined1 *)((long)&in_RDI->_vptr_IKernel + 4));
  (**(code **)(*in_RDI[4]._vptr_IKernel + 0x30))
            (in_RDI[4]._vptr_IKernel,5,(undefined1 *)((long)&in_RDI[1]._vptr_IKernel + 4),in_RDI + 1
            );
  InitGameLayer((CLayers *)pMap);
  InitTilemapSkip(this);
  return;
}

Assistant:

void CLayers::Init(class IKernel *pKernel, IMap *pMap)
{
	m_pMap = pMap ? pMap : pKernel->RequestInterface<IMap>();
	m_pMap->GetType(MAPITEMTYPE_GROUP, &m_GroupsStart, &m_GroupsNum);
	m_pMap->GetType(MAPITEMTYPE_LAYER, &m_LayersStart, &m_LayersNum);

	InitGameLayer();
	InitTilemapSkip();
}